

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

ssize_t zt_cstr_rupto(char *s,ssize_t i,ssize_t j,char *set)

{
  size_t i_00;
  ssize_t sVar1;
  char *pcVar2;
  char *in_RCX;
  char *in_RDI;
  ssize_t t;
  size_t len;
  size_t in_stack_ffffffffffffffc8;
  long local_20;
  long local_18;
  
  i_00 = strlen(in_RDI);
  if (i_00 == 0) {
    local_18 = 0;
    local_20 = 0;
  }
  else {
    local_18 = IDX(i_00,in_stack_ffffffffffffffc8);
    sVar1 = IDX(i_00,in_stack_ffffffffffffffc8);
    local_20 = sVar1;
    if (sVar1 < local_18) {
      local_20 = local_18;
      local_18 = sVar1;
    }
  }
  while( true ) {
    if (local_20 < local_18) {
      return -1;
    }
    pcVar2 = strchr(in_RCX,(int)in_RDI[local_20]);
    if (pcVar2 != (char *)0x0) break;
    local_20 = local_20 + -1;
  }
  return local_20;
}

Assistant:

ssize_t
zt_cstr_rupto(const char *s, ssize_t i, ssize_t j, const char *set) {
    zt_assert(set);

    CONVERT(s, i, j);
    for (; j >= i; j--) {
        if (strchr(set, s[j])) {
            return j;
        }
    }

    return -1;
}